

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O0

void __thiscall TPZGraphElT::NextIJ(TPZGraphElT *this,int no,TPZVec<int> *co,int incr)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  TPZVec<int> *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int imax;
  int res;
  byte local_20;
  
  iVar1 = TPZGraphMesh::Res(*(TPZGraphMesh **)(in_RDI + 0x10));
  local_20 = (byte)iVar1;
  switch(in_ESI) {
  case 0:
  case 1:
  case 2:
    break;
  case 3:
    piVar2 = TPZVec<int>::operator[](in_RDX,0);
    *piVar2 = in_ECX + *piVar2;
    break;
  case 4:
    piVar2 = TPZVec<int>::operator[](in_RDX,0);
    *piVar2 = in_ECX + *piVar2;
    piVar2 = TPZVec<int>::operator[](in_RDX,1);
    *piVar2 = *piVar2 - in_ECX;
    break;
  case 5:
    piVar2 = TPZVec<int>::operator[](in_RDX,1);
    *piVar2 = in_ECX + *piVar2;
    break;
  case 6:
    piVar2 = TPZVec<int>::operator[](in_RDX,1);
    *piVar2 = *piVar2 + 1;
    piVar2 = TPZVec<int>::operator[](in_RDX,0);
    iVar1 = *piVar2;
    piVar2 = TPZVec<int>::operator[](in_RDX,1);
    if (1 << (local_20 & 0x1f) <= iVar1 + *piVar2) {
      piVar2 = TPZVec<int>::operator[](in_RDX,1);
      *piVar2 = 1;
      piVar2 = TPZVec<int>::operator[](in_RDX,0);
      *piVar2 = *piVar2 + 1;
    }
  }
  return;
}

Assistant:

void TPZGraphElT::NextIJ(int no, TPZVec<int> &co, int incr){
	int res = fGraphMesh->Res();
	int imax;
	imax = 1 << res;
	switch(no) {
		case 0:
		case 1:
		case 2:
			return;
		case 3:
			co[0] += incr;
			break;
		case 4:
			co[0] += incr;
			co[1] -= incr;
			break;
		case 5:
			co[1]+= incr;
			break;
		case 6:
			co[1]++;
			if(co[0]+co[1]>= imax) {
				co[1] = 1;
				co[0]++;
			}
			break;
	}
}